

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void fiobj_stack___require_on_top(fiobj_stack_s *ary,size_t len)

{
  size_t sVar1;
  FIOBJ *pFVar2;
  int *piVar3;
  size_t len_local;
  fiobj_stack_s *ary_local;
  
  if (ary->capa <= ary->end + len) {
    sVar1 = (len + ary->end & 0xfffffffffffffffe) + 2;
    pFVar2 = (FIOBJ *)fio_realloc2(ary->arry,sVar1 * 8,ary->end << 3);
    ary->arry = pFVar2;
    if (ary->arry == (FIOBJ *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                      );
      }
      kill(0,2);
      piVar3 = __errno_location();
      exit(*piVar3);
    }
    ary->capa = sVar1;
  }
  return;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}